

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  bool bVar1;
  CppType CVar2;
  uint32 uVar3;
  MessageLite *pMVar4;
  Message **ppMVar5;
  undefined8 *puVar6;
  Message *pMVar7;
  void *pvVar8;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x43] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar4 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),field
                        ,factory);
    return (Message *)pMVar4;
  }
  this_00 = &this->schema_;
  uVar3 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
  bVar1 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar1) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      ClearOneof(this,message,*(OneofDescriptor **)(field + 0x58));
      ppMVar5 = MutableField<google::protobuf::Message*>(this,message,field);
      puVar6 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
      pvVar8 = (message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar8 & 1) != 0) {
        pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
      }
      pMVar7 = (Message *)(**(code **)(*(long *)*puVar6 + 0x20))((long *)*puVar6,pvVar8);
      *ppMVar5 = pMVar7;
      goto LAB_002ee5e7;
    }
  }
  else {
    SetBit(this,message,field);
  }
  ppMVar5 = (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  pMVar7 = *ppMVar5;
LAB_002ee5e7:
  if (pMVar7 == (Message *)0x0) {
    puVar6 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
    pvVar8 = (message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pvVar8 & 1) != 0) {
      pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
    }
    pMVar7 = (Message *)(**(code **)(*(long *)*puVar6 + 0x20))((long *)*puVar6,pvVar8);
    *ppMVar5 = pMVar7;
  }
  return pMVar7;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}